

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormatLite::UInt32Size(RepeatedField<unsigned_int> *value)

{
  int iVar1;
  uint *puVar2;
  size_t sVar3;
  undefined4 local_20;
  int i;
  int n;
  size_t out;
  RepeatedField<unsigned_int> *value_local;
  
  _i = 0;
  iVar1 = RepeatedField<unsigned_int>::size(value);
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    puVar2 = RepeatedField<unsigned_int>::Get(value,local_20);
    sVar3 = UInt32Size(*puVar2);
    _i = sVar3 + _i;
  }
  return _i;
}

Assistant:

size_t WireFormatLite::UInt32Size(const RepeatedField<uint32>& value) {
  size_t out = 0;
  const int n = value.size();
  for (int i = 0; i < n; i++) {
    out += UInt32Size(value.Get(i));
  }
  return out;
}